

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledPixel.cxx
# Opt level: O2

PixelStyle SSD1306::oppositeStyle(PixelStyle style)

{
  if (style < 4) {
    return *(PixelStyle *)(&DAT_001072e4 + (ulong)style * 4);
  }
  return None;
}

Assistant:

SSD1306::PixelStyle
SSD1306::oppositeStyle(
    PixelStyle style)
{
    PixelStyle opposite{PixelStyle::None};

    switch (style)
    {
    case PixelStyle::Set:

        opposite = PixelStyle::Unset;
        break;

    case PixelStyle::Unset:

        opposite = PixelStyle::Set;
        break;

    case PixelStyle::Xor:

        opposite = PixelStyle::Xor;
        break;

    case PixelStyle::None:

        opposite = PixelStyle::Xor;
        break;
    }

    return opposite;
}